

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O2

void outputHandleMode(void *userData,wl_output *output,uint32_t flags,int32_t width,int32_t height,
                     int32_t refresh)

{
  long lVar1;
  void *pvVar2;
  double dVar3;
  
  dVar3 = round((double)refresh / 1000.0);
  lVar1 = (long)*(int *)((long)userData + 0xa0) + 1;
  *(int *)((long)userData + 0xa0) = (int)lVar1;
  pvVar2 = _glfw_realloc(*(void **)((long)userData + 0x98),lVar1 * 0x18);
  *(void **)((long)userData + 0x98) = pvVar2;
  lVar1 = (long)*(int *)((long)userData + 0xa0) * 0x18;
  *(int32_t *)((long)pvVar2 + lVar1 + -0x18) = width;
  *(int32_t *)((long)pvVar2 + lVar1 + -0x14) = height;
  *(undefined8 *)((long)pvVar2 + lVar1 + -0x10) = 0x800000008;
  *(undefined4 *)((long)pvVar2 + lVar1 + -8) = 8;
  *(int *)((long)pvVar2 + lVar1 + -4) = (int)dVar3;
  if ((flags & 1) != 0) {
    *(int *)((long)userData + 0x10c) = *(int *)((long)userData + 0xa0) + -1;
  }
  return;
}

Assistant:

static void outputHandleMode(void* userData,
                             struct wl_output* output,
                             uint32_t flags,
                             int32_t width,
                             int32_t height,
                             int32_t refresh)
{
    struct _GLFWmonitor* monitor = userData;
    GLFWvidmode mode;

    mode.width = width;
    mode.height = height;
    mode.redBits = 8;
    mode.greenBits = 8;
    mode.blueBits = 8;
    mode.refreshRate = (int) round(refresh / 1000.0);

    monitor->modeCount++;
    monitor->modes =
        _glfw_realloc(monitor->modes, monitor->modeCount * sizeof(GLFWvidmode));
    monitor->modes[monitor->modeCount - 1] = mode;

    if (flags & WL_OUTPUT_MODE_CURRENT)
        monitor->wl.currentMode = monitor->modeCount - 1;
}